

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

void __thiscall
siamese::RecoveryMatrixState::PopulateRows(RecoveryMatrixState *this,uint oldRows,uint newRows)

{
  undefined8 *puVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  RowInfo *rowPtr;
  uint rowIndex;
  RecoveryPacket *recovery;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffaa8;
  LogStringBuffer *in_stack_fffffffffffffab0;
  LogStringBuffer *buffer_00;
  OutputWorker *pOVar2;
  OutputWorker *this_00;
  uint in_stack_fffffffffffffb14;
  LightVector<siamese::RecoveryMatrixState::RowInfo,_25U> *in_stack_fffffffffffffb18;
  undefined8 *puVar3;
  LogStringBuffer local_418;
  uint *local_290;
  char *local_288;
  uint *local_280;
  char *local_278;
  uint *local_270;
  char *local_268;
  undefined4 local_25c;
  undefined8 *local_258;
  uint *local_250;
  char *local_248;
  uint *local_240;
  char *local_238;
  uint *local_230;
  char *local_228;
  undefined *local_220;
  LogStringBuffer *local_218;
  undefined8 *local_210;
  undefined *local_208;
  LogStringBuffer *local_200;
  undefined8 *local_1f8;
  undefined *local_1f0;
  LogStringBuffer *local_1e8;
  uint *local_1e0;
  char *local_1d8;
  uint *local_1d0;
  char *local_1c8;
  uint *local_1c0;
  char *local_1b8;
  LogStringBuffer *local_1b0;
  OutputWorker *local_1a8;
  char *local_1a0;
  LogStringBuffer *local_198;
  OutputWorker *local_190;
  char *local_188;
  LogStringBuffer *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  char *local_160;
  uint *local_158;
  LogStringBuffer *local_150;
  OutputWorker *local_148;
  uint *local_140;
  LogStringBuffer *local_138;
  OutputWorker *local_130;
  uint *local_128;
  LogStringBuffer *local_120;
  uint *local_118;
  char *local_110;
  uint *local_108;
  char *local_100;
  LogStringBuffer *local_f8;
  OutputWorker *local_f0;
  char *local_e8;
  LogStringBuffer *local_e0;
  OutputWorker *local_d8;
  char *local_d0;
  LogStringBuffer *local_c8;
  uint *local_c0;
  char *local_b8;
  uint *local_b0;
  LogStringBuffer *local_a8;
  OutputWorker *local_a0;
  uint *local_98;
  LogStringBuffer *local_90;
  OutputWorker *local_88;
  uint *local_80;
  LogStringBuffer *local_78;
  uint *local_70;
  char *local_68;
  LogStringBuffer *local_60;
  OutputWorker *local_58;
  uint *local_50;
  LogStringBuffer *local_48;
  OutputWorker *local_40;
  uint *local_38;
  LogStringBuffer *local_30;
  char *local_28;
  LogStringBuffer *local_20;
  OutputWorker *local_18;
  char *local_10;
  LogStringBuffer *local_8;
  
  if (in_ESI < in_EDX) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::RowInfo,_25U>::SetSize_Copy
              (in_stack_fffffffffffffb18,in_stack_fffffffffffffb14);
    if (in_ESI == 0) {
      puVar3 = *(undefined8 **)(*(long *)(in_RDI + 0x10) + 0x10);
    }
    else {
      puVar3 = (undefined8 *)
               **(undefined8 **)(*(long *)(in_RDI + 0x1b0) + (long)(int)(in_ESI - 1) * 0x10);
    }
    for (; in_ESI < in_EDX; in_ESI = in_ESI + 1) {
      puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x1b0) + (long)(int)in_ESI * 0x10);
      *puVar1 = puVar3;
      *(undefined1 *)(puVar1 + 1) = 0;
      *(undefined4 *)((long)puVar1 + 0xc) = *(undefined4 *)(puVar3 + 5);
      local_270 = (uint *)((long)puVar3 + 0x14);
      local_280 = (uint *)(puVar3 + 3);
      local_290 = (uint *)((long)puVar3 + 0x1c);
      if (DAT_002b63a8 < 3) {
        local_258 = &Logger;
        local_25c = 2;
        local_268 = "*** Recovery packet: start=";
        local_278 = " Sum_Count=";
        local_288 = " LDPC_Count=";
        buffer_00 = &local_418;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,Trace);
        local_220 = &DAT_002b63d8;
        local_210 = &Logger;
        local_228 = local_268;
        local_230 = local_270;
        local_238 = local_278;
        local_240 = local_280;
        local_248 = local_288;
        local_250 = local_290;
        pOVar2 = (OutputWorker *)&Logger;
        local_1f8 = &Logger;
        local_218 = buffer_00;
        local_208 = local_220;
        local_200 = buffer_00;
        local_1f0 = local_220;
        local_1e8 = buffer_00;
        std::operator<<((ostream *)&buffer_00->LogStream,(string *)&DAT_002b63d8);
        local_1b0 = local_218;
        local_1b8 = local_228;
        local_1c0 = local_230;
        local_1c8 = local_238;
        local_1d0 = local_240;
        local_1d8 = local_248;
        local_1e0 = local_250;
        local_198 = local_218;
        local_1a0 = local_228;
        local_180 = local_218;
        local_188 = local_228;
        this_00 = pOVar2;
        local_1a8 = pOVar2;
        local_190 = pOVar2;
        std::operator<<((ostream *)&local_218->LogStream,local_228);
        local_150 = local_1b0;
        local_158 = local_1c0;
        local_160 = local_1c8;
        local_168 = local_1d0;
        local_170 = local_1d8;
        local_178 = local_1e0;
        local_138 = local_1b0;
        local_140 = local_1c0;
        local_120 = local_1b0;
        local_128 = local_1c0;
        local_148 = pOVar2;
        local_130 = pOVar2;
        std::ostream::operator<<((ostream *)&local_1b0->LogStream,*local_1c0);
        local_f8 = local_150;
        local_100 = local_160;
        local_108 = local_168;
        local_110 = local_170;
        local_118 = local_178;
        local_e0 = local_150;
        local_e8 = local_160;
        local_c8 = local_150;
        local_d0 = local_160;
        local_f0 = pOVar2;
        local_d8 = pOVar2;
        std::operator<<((ostream *)&local_150->LogStream,local_160);
        local_a8 = local_f8;
        local_b0 = local_108;
        local_b8 = local_110;
        local_c0 = local_118;
        local_90 = local_f8;
        local_98 = local_108;
        local_78 = local_f8;
        local_80 = local_108;
        local_a0 = pOVar2;
        local_88 = pOVar2;
        std::ostream::operator<<((ostream *)&local_f8->LogStream,*local_108);
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        local_20 = local_a8;
        local_28 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        local_58 = pOVar2;
        local_18 = pOVar2;
        std::operator<<((ostream *)&local_a8->LogStream,local_b8);
        local_48 = local_60;
        local_50 = local_70;
        local_30 = local_60;
        local_38 = local_70;
        local_40 = pOVar2;
        std::ostream::operator<<((ostream *)&local_60->LogStream,*local_70);
        in_stack_fffffffffffffab0 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d280d);
      }
      puVar3 = (undefined8 *)*puVar3;
    }
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateRows(const unsigned oldRows, const unsigned newRows)
{
    if (oldRows >= newRows)
        return;

    Rows.SetSize_Copy(newRows);

    RecoveryPacket* recovery;
    if (oldRows > 0)
        recovery = Rows.GetRef(oldRows - 1).Recovery->Next;
    else
        recovery = CheckedRegion->FirstRecovery;
    SIAMESE_DEBUG_ASSERT(recovery);

    for (unsigned rowIndex = oldRows; rowIndex < newRows; ++rowIndex, recovery = recovery->Next)
    {
        RowInfo* rowPtr = Rows.GetPtr(rowIndex);
        rowPtr->Recovery          = recovery;
        rowPtr->UsedForSolution   = false;
        rowPtr->MatrixColumnCount = recovery->LostCount;

        Logger.Info("*** Recovery packet: start=", recovery->Metadata.ColumnStart,  " Sum_Count=",  recovery->Metadata.SumCount,  " LDPC_Count=",  recovery->Metadata.LDPCCount);
    }
}